

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O0

digits_t icu_63::number::impl::roundingutils::doubleFractionLength(double input)

{
  short local_34 [2];
  short local_30 [2];
  int32_t point;
  int32_t length;
  bool sign;
  char buffer [18];
  double input_local;
  
  unique0x1000006c = input;
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (input,SHORTEST,0,(char *)&length,0x12,(bool *)((long)&point + 3),(int *)local_30,
             (int *)local_34);
  return local_30[0] - local_34[0];
}

Assistant:

digits_t roundingutils::doubleFractionLength(double input) {
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 1];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
            input,
            DoubleToStringConverter::DtoaMode::SHORTEST,
            0,
            buffer,
            sizeof(buffer),
            &sign,
            &length,
            &point
    );

    return static_cast<digits_t>(length - point);
}